

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

void __thiscall
cs_impl::
cni_helper<void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
::_call<0,1>(cni_helper<void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&),void(*)(std::deque<cs_impl::any,std::allocator<cs_impl::any>>&,cs_impl::any_const&)>
             *this,vector *args,sequence<0,_1> *param_2)

{
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar1;
  
  pdVar1 = try_convert_and_check<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_&,_std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>,_0UL>
           ::convert((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  if (*(long *)(this + 0x10) != 0) {
    (**(code **)(this + 0x18))
              (this,pdVar1,
               (args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
               super__Vector_impl_data._M_start + 1,*(code **)(this + 0x18));
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}